

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

void __thiscall
GlobOpt::TypeSpecializeIntDst
          (GlobOpt *this,Instr *instr,OpCode originalOpCode,Value *valToTransfer,Value *src1Value,
          Value *src2Value,BailOutKind bailOutKind,ValueType valueType,int32 newMin,int32 newMax,
          Value **pDstVal,AddSubConstantInfo *addSubConstantInfo)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  OpndKind OVar4;
  ValueType VVar5;
  int32 n;
  undefined4 *puVar6;
  Value *pVVar7;
  IntBounds *bounds;
  ulong uVar8;
  undefined6 in_register_00000012;
  char *this_00;
  Instr *instr_00;
  GlobOpt *dst;
  undefined2 in_stack_00000012;
  IntConstantBounds local_74;
  uint local_6c;
  Value *local_68;
  Value *local_60;
  Value *local_58;
  GlobOpt *local_50;
  GlobOpt *local_48;
  Instr *local_40;
  int32 local_38;
  int32 local_34;
  
  local_6c = (uint)CONCAT62(in_register_00000012,originalOpCode);
  local_38 = newMax;
  local_34 = newMin;
  bVar2 = ValueType::IsInt(&valueType);
  local_60 = src2Value;
  if ((!bVar2) &&
     ((bVar2 = ValueType::IsNumber(&valueType), !bVar2 ||
      (bVar2 = ValueType::IsLikelyInt(&valueType), (newMax != 0 || newMin != 0) || !bVar2)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2191,
                       "(valueType.IsInt() || (valueType.IsNumber() && valueType.IsLikelyInt() && newMin == 0 && newMax == 0))"
                       ,
                       "valueType.IsInt() || (valueType.IsNumber() && valueType.IsLikelyInt() && newMin == 0 && newMax == 0)"
                      );
    if (!bVar2) goto LAB_0046866f;
    *puVar6 = 0;
    src2Value = local_60;
  }
  local_68 = valToTransfer;
  if (valToTransfer != src1Value && valToTransfer != (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2192,"(!valToTransfer || valToTransfer == src1Value)",
                       "!valToTransfer || valToTransfer == src1Value");
    if (!bVar2) goto LAB_0046866f;
    *puVar6 = 0;
  }
  if ((addSubConstantInfo != (AddSubConstantInfo *)0x0) &&
     (addSubConstantInfo->srcSym == (StackSym *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2193,"(!addSubConstantInfo || addSubConstantInfo->HasInfo())",
                       "!addSubConstantInfo || addSubConstantInfo->HasInfo()");
    if (!bVar2) goto LAB_0046866f;
    *puVar6 = 0;
  }
  dst = (GlobOpt *)instr->m_dst;
  if (dst == (GlobOpt *)0x0) {
    AssertCount = AssertCount + 1;
    local_50 = this;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2196,"(dst)","dst");
    if (!bVar2) goto LAB_0046866f;
    *puVar6 = 0;
    this = local_50;
  }
  local_58 = src1Value;
  local_40 = instr;
  if (this->prePassLoop == (Loop *)0x0) {
    bVar2 = true;
  }
  else {
    pVVar7 = (Value *)0x0;
    bVar2 = IsPrepassSrcValueInfoPrecise(this,instr,src1Value,src2Value,(bool *)0x0);
    VVar5 = GetPrepassValueTypeForDst
                      (this,(ValueType)SUB42(_valueType,0),instr,src2Value,pVVar7,bVar2,false);
    _valueType = CONCAT22(in_stack_00000012,VVar5.field_0);
  }
  if ((((this->field_0xf5 & 2) != 0) || (this->prePassLoop == (Loop *)0x0)) ||
     (bVar3 = ValueType::IsInt(&valueType), bVar3)) {
    if (((addSubConstantInfo == (AddSubConstantInfo *)0x0) ||
        (bVar3 = AddSubConstantInfo::SrcValueIsLikelyConstant(addSubConstantInfo), bVar3)) ||
       ((*(uint *)&this->field_0xf4 >> 0x14 & 1) == 0)) {
      bounds = (IntBounds *)0x0;
    }
    else {
      local_50 = this;
      local_48 = dst;
      if ((*(uint *)&this->field_0xf4 & 4) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x21b3,"(!ignoredIntOverflowForCurrentInstr)",
                           "!ignoredIntOverflowForCurrentInstr");
        if (!bVar3) goto LAB_0046866f;
        *puVar6 = 0;
      }
      bVar3 = ValueType::IsInt(&valueType);
      bVar3 = (bVar2 & bVar3) == 0;
      if (bVar3) {
        newMax = 0x7fffffff;
      }
      if (bVar3) {
        newMin = -0x80000000;
      }
      pVVar7 = AddSubConstantInfo::SrcValue(addSubConstantInfo);
      n = AddSubConstantInfo::Offset(addSubConstantInfo);
      local_38 = newMax;
      local_34 = newMin;
      IntConstantBounds::IntConstantBounds(&local_74,newMin,newMax);
      this = local_50;
      bounds = IntBounds::Add(pVVar7,n,bVar2,&local_74,local_50->alloc);
      dst = local_48;
    }
    if (local_68 == (Value *)0x0) {
      bVar3 = ValueType::IsInt(&valueType);
      instr_00 = local_40;
      pVVar7 = local_58;
      if ((bVar2 & bVar3) == 1) {
        if (local_38 < 0 || 0 < local_34) {
          bVar2 = false;
        }
        else {
          bVar2 = false;
          if ((ushort)local_6c < 0x34) {
            uVar8 = (ulong)(local_6c & 0xffff);
            if ((0x3410000000000U >> (uVar8 & 0x3f) & 1) == 0) {
              if (uVar8 == 0x2d) {
                if (local_58 == (Value *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                  *puVar6 = 1;
                  bVar2 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                     ,0x21d9,"(src1Value)","src1Value");
                  if (!bVar2) goto LAB_0046866f;
                  *puVar6 = 0;
                }
                if (local_60 == (Value *)0x0) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                  *puVar6 = 1;
                  bVar2 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                     ,0x21da,"(src2Value)","src2Value");
                  if (!bVar2) goto LAB_0046866f;
                  *puVar6 = 0;
                }
                bVar2 = ValueInfo::WasNegativeZeroPreventedByBailout(local_58->valueInfo);
                if (bVar2) {
                  bVar2 = ValueInfo::WasNegativeZeroPreventedByBailout(local_60->valueInfo);
                }
                else {
                  bVar2 = false;
                }
              }
              else {
                bVar2 = false;
                if (uVar8 == 0x33) {
                  local_48 = dst;
                  if (local_58 == (Value *)0x0) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                    *puVar6 = 1;
                    bVar2 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                                       ,0x21e2,"(src1Value)","src1Value");
                    if (!bVar2) goto LAB_0046866f;
                    *puVar6 = 0;
                  }
                  bVar2 = ValueInfo::WasNegativeZeroPreventedByBailout(pVVar7->valueInfo);
                  dst = local_48;
                }
              }
            }
            else {
              bVar2 = (bool)((byte)(bailOutKind >> 0xc) & 1);
            }
          }
        }
        if (bounds == (IntBounds *)0x0) {
          pVVar7 = NewIntRangeValue(this,local_34,local_38,bVar2,(Opnd *)0x0);
        }
        else {
          pVVar7 = NewIntBoundedValue(this,(ValueType)SUB42(_valueType,0),bounds,bVar2,(Opnd *)0x0);
        }
      }
      else if (bounds == (IntBounds *)0x0) {
        pVVar7 = NewGenericValue(this,valueType,(Opnd *)0x0);
        instr_00 = local_40;
      }
      else {
        pVVar7 = NewIntBoundedValue(this,valueType,bounds,false,(Opnd *)0x0);
        instr_00 = local_40;
      }
      *pDstVal = pVVar7;
    }
    else {
      if (addSubConstantInfo != (AddSubConstantInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x21cc,"(!addSubConstantInfo)","!addSubConstantInfo");
        if (!bVar2) goto LAB_0046866f;
        *puVar6 = 0;
      }
      instr_00 = local_40;
      pVVar7 = local_68;
      if (this->prePassLoop != (Loop *)0x0) {
        pVVar7 = ValueNumberTransferDstInPrepass(this,local_40,local_68);
      }
      *pDstVal = pVVar7;
      GlobOptBlockData::InsertNewValue(&this->currentBlock->globOptData,pVVar7,(Opnd *)dst);
    }
    if ((addSubConstantInfo != (AddSubConstantInfo *)0x0) || ((this->field_0xf4 & 0x40) != 0)) {
      TrackIntSpecializedAddSubConstant
                (this,instr_00,addSubConstantInfo,*pDstVal,bounds != (IntBounds *)0x0);
    }
    GlobOptBlockData::SetValue(&this->currentBlock->globOptData,*pDstVal,(Opnd *)dst);
    OVar4 = IR::Opnd::GetKind((Opnd *)dst);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x2200,"(dst->IsRegOpnd())","What else?");
      if (!bVar2) goto LAB_0046866f;
      *puVar6 = 0;
    }
    OVar4 = IR::Opnd::GetKind((Opnd *)dst);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) {
LAB_0046866f:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    ToInt32Dst(this,instr_00,(RegOpnd *)dst,this->currentBlock);
  }
  else {
    OVar4 = IR::Opnd::GetKind((Opnd *)dst);
    if (OVar4 == OpndKindReg) {
      this_00 = (char *)dst;
      OVar4 = IR::Opnd::GetKind((Opnd *)dst);
      if (OVar4 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        this_00 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
        ;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar2) goto LAB_0046866f;
        *puVar6 = 0;
      }
      ToVarStackSym((GlobOpt *)this_00,(StackSym *)dst->intConstantToStackSymMap,this->currentBlock)
      ;
    }
  }
  return;
}

Assistant:

void
GlobOpt::TypeSpecializeIntDst(IR::Instr* instr, Js::OpCode originalOpCode, Value* valToTransfer, Value *const src1Value, Value *const src2Value, const IR::BailOutKind bailOutKind, ValueType valueType, int32 newMin, int32 newMax, Value** pDstVal, const AddSubConstantInfo *const addSubConstantInfo)
{
    Assert(valueType.IsInt() || (valueType.IsNumber() && valueType.IsLikelyInt() && newMin == 0 && newMax == 0));
    Assert(!valToTransfer || valToTransfer == src1Value);
    Assert(!addSubConstantInfo || addSubConstantInfo->HasInfo());

    IR::Opnd *dst = instr->GetDst();
    Assert(dst);

    bool isValueInfoPrecise;
    if(IsLoopPrePass())
    {
        isValueInfoPrecise = IsPrepassSrcValueInfoPrecise(instr, src1Value, src2Value);
        valueType = GetPrepassValueTypeForDst(valueType, instr, src1Value, src2Value, isValueInfoPrecise);
    }
    else
    {
        isValueInfoPrecise = true;
    }

    // If dst has a circular reference in a loop, it probably won't get specialized. Don't mark the dst as type-specialized on
    // the pre-pass. With aggressive int spec though, it will take care of bailing out if necessary so there's no need to assume
    // that the dst will be a var even if it's live on the back-edge. Also if the op always produces an int32, then there's no
    // ambiguity in the dst's value type even in the prepass.
    if (!DoAggressiveIntTypeSpec() && this->IsLoopPrePass() && !valueType.IsInt())
    {
        if (dst->IsRegOpnd())
        {
            this->ToVarRegOpnd(dst->AsRegOpnd(), this->currentBlock);
        }
        return;
    }

    const IntBounds *dstBounds = nullptr;
    if(addSubConstantInfo && !addSubConstantInfo->SrcValueIsLikelyConstant() && DoTrackRelativeIntBounds())
    {
        Assert(!ignoredIntOverflowForCurrentInstr);

        // Track bounds for add or sub with a constant. For instance, consider (b = a + 2). The value of 'b' should track that
        // it is equal to (the value of 'a') + 2. Additionally, the value of 'b' should inherit the bounds of 'a', offset by
        // the constant value.
        if(!valueType.IsInt() || !isValueInfoPrecise)
        {
            newMin = INT32_MIN;
            newMax = INT32_MAX;
        }
        dstBounds =
            IntBounds::Add(
                addSubConstantInfo->SrcValue(),
                addSubConstantInfo->Offset(),
                isValueInfoPrecise,
                IntConstantBounds(newMin, newMax),
                alloc);
    }

    // Src1's value could change later in the loop, so the value wouldn't be the same for each
    // iteration.  Since we don't iterate over loops "while (!changed)", go conservative on the
    // pre-pass.
    if (valToTransfer)
    {
        // If this is just a copy, no need for creating a new value.
        Assert(!addSubConstantInfo);
        *pDstVal = this->ValueNumberTransferDst(instr, valToTransfer);
        CurrentBlockData()->InsertNewValue(*pDstVal, dst);
    }
    else if (valueType.IsInt() && isValueInfoPrecise)
    {
        bool wasNegativeZeroPreventedByBailout = false;
        if(newMin <= 0 && newMax >= 0)
        {
            switch(originalOpCode)
            {
                case Js::OpCode::Add_A:
                    // -0 + -0 == -0
                    Assert(src1Value);
                    Assert(src2Value);
                    wasNegativeZeroPreventedByBailout =
                        src1Value->GetValueInfo()->WasNegativeZeroPreventedByBailout() &&
                        src2Value->GetValueInfo()->WasNegativeZeroPreventedByBailout();
                    break;

                case Js::OpCode::Sub_A:
                    // -0 - 0 == -0
                    Assert(src1Value);
                    wasNegativeZeroPreventedByBailout = src1Value->GetValueInfo()->WasNegativeZeroPreventedByBailout();
                    break;

                case Js::OpCode::Neg_A:
                case Js::OpCode::Mul_A:
                case Js::OpCode::Div_A:
                case Js::OpCode::Rem_A:
                    wasNegativeZeroPreventedByBailout = !!(bailOutKind & IR::BailOutOnNegativeZero);
                    break;
            }
        }

        *pDstVal =
            dstBounds
                ? NewIntBoundedValue(valueType, dstBounds, wasNegativeZeroPreventedByBailout, nullptr)
                : NewIntRangeValue(newMin, newMax, wasNegativeZeroPreventedByBailout, nullptr);
    }
    else
    {
        *pDstVal = dstBounds ? NewIntBoundedValue(valueType, dstBounds, false, nullptr) : NewGenericValue(valueType);
    }

    if(addSubConstantInfo || updateInductionVariableValueNumber)
    {
        TrackIntSpecializedAddSubConstant(instr, addSubConstantInfo, *pDstVal, !!dstBounds);
    }

    CurrentBlockData()->SetValue(*pDstVal, dst);

    AssertMsg(dst->IsRegOpnd(), "What else?");
    this->ToInt32Dst(instr, dst->AsRegOpnd(), this->currentBlock);
}